

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_new_string8(JSContext *ctx,uint8_t *buf,int len)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSRefCountHeader *p;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  if (len < 1) {
    JVar3 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
    *(int *)JVar3.ptr = *JVar3.ptr + 1;
    iVar2 = -7;
  }
  else {
    JVar3.float64 = 0.0;
    JVar1.ptr = js_alloc_string(ctx,len,0);
    if ((JSString *)JVar1.ptr == (JSString *)0x0) {
      iVar2 = 6;
    }
    else {
      memcpy((JSString *)((long)JVar1.ptr + 0x10),buf,(ulong)(uint)len);
      *(undefined1 *)((long)JVar1.ptr + (ulong)(uint)len + 0x10) = 0;
      iVar2 = -7;
      JVar3.ptr = JVar1.ptr;
    }
  }
  JVar4.tag = iVar2;
  JVar4.u.ptr = JVar3.ptr;
  return JVar4;
}

Assistant:

static JSValue js_new_string8(JSContext *ctx, const uint8_t *buf, int len)
{
    JSString *str;

    if (len <= 0) {
        return JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    str = js_alloc_string(ctx, len, 0);
    if (!str)
        return JS_EXCEPTION;
    memcpy(str->u.str8, buf, len);
    str->u.str8[len] = '\0';
    return JS_MKPTR(JS_TAG_STRING, str);
}